

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O1

void __thiscall raptor::Thread::Join(Thread *this)

{
  long in_RSI;
  IThreadService *pIVar1;
  
  pIVar1 = this->_impl;
  if (pIVar1 == (IThreadService *)0x0) {
    if (this->_state != kFailed) {
      Join();
      pIVar1[2]._vptr_IThreadService = (_func_int **)0x0;
      pIVar1[3]._vptr_IThreadService = (_func_int **)0x0;
      pIVar1->_vptr_IThreadService = (_func_int **)0x0;
      pIVar1[1]._vptr_IThreadService = (_func_int **)0x0;
      if (*(code **)(in_RSI + 0x10) != (code *)0x0) {
        (**(code **)(in_RSI + 0x10))();
        pIVar1[3]._vptr_IThreadService = *(_func_int ***)(in_RSI + 0x18);
        pIVar1[2]._vptr_IThreadService = *(_func_int ***)(in_RSI + 0x10);
      }
      return;
    }
  }
  else {
    if (this->_state == kAlive) {
      this->_state = kActive;
      (*pIVar1->_vptr_IThreadService[2])();
    }
    (*this->_impl->_vptr_IThreadService[3])();
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_state = kFinish;
    this->_impl = (IThreadService *)0x0;
  }
  return;
}

Assistant:

void Thread::Join() {
    if (_impl != nullptr) {
        if (_state == kAlive) {
            _state = kActive;
            _impl->Start();
        }
        _impl->Join();
        delete _impl;
        _state = kFinish;
        _impl = nullptr;
    } else {
        RAPTOR_ASSERT(_state == kFailed);
    }
}